

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O3

void NOPN2_Write(ym3438_t *chip,Bit32u port,Bit8u data)

{
  undefined3 in_register_00000011;
  
  chip->write_data = (ushort)((port & 2) << 7) | (ushort)CONCAT31(in_register_00000011,data);
  if ((port & 1) == 0) {
    chip->write_a = chip->write_a | 1;
    return;
  }
  chip->write_d = chip->write_d | 1;
  return;
}

Assistant:

void NOPN2_Write(ym3438_t *chip, Bit32u port, Bit8u data)
{
    port &= 3;
    chip->write_data = ((port << 7) & 0x100) | data;
    if (port & 1)
    {
        /* Data */
        chip->write_d |= 1;
    }
    else
    {
        /* Address */
        chip->write_a |= 1;
    }
}